

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O2

void __thiscall
node::SnapshotMetadata::SnapshotMetadata
          (SnapshotMetadata *this,MessageStartChars network_magic,uint256 *base_blockhash,
          uint64_t coins_count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long in_FS_OFFSET;
  initializer_list<unsigned_short> __l;
  allocator_type local_2c;
  less<unsigned_short> local_2b;
  unsigned_short local_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2a = 2;
  __l._M_len = 1;
  __l._M_array = &local_2a;
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            (&this->m_supported_versions,__l,&local_2b,&local_2c);
  *&(this->m_network_magic)._M_elems = network_magic._M_elems;
  uVar1 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 4);
  uVar2 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 8);
  uVar3 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 0xc);
  uVar4 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 0x10);
  uVar5 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 0x14);
  uVar6 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 0x18);
  uVar7 = *(undefined4 *)((base_blockhash->super_base_blob<256U>).m_data._M_elems + 0x1c);
  *(undefined4 *)(this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems =
       *(undefined4 *)(base_blockhash->super_base_blob<256U>).m_data._M_elems;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 4) = uVar1;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8) = uVar2;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar3;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar4;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar5;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
  *(undefined4 *)((this->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar7;
  this->m_coins_count = coins_count;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SnapshotMetadata(
        const MessageStartChars network_magic,
        const uint256& base_blockhash,
        uint64_t coins_count) :
            m_network_magic(network_magic),
            m_base_blockhash(base_blockhash),
            m_coins_count(coins_count) { }